

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void changemode(UINT8 noEcho)

{
  termios newterm;
  termios local_58;
  
  if (termmode == 0xff) {
    tcgetattr(0,(termios *)&oldterm);
    termmode = '\0';
  }
  if (termmode != noEcho) {
    if (noEcho == '\0') {
      tcsetattr(0,0,(termios *)&oldterm);
      termmode = '\0';
    }
    else {
      local_58.c_iflag = oldterm.c_iflag;
      local_58.c_oflag = oldterm.c_oflag;
      local_58.c_cc[0x1f] = oldterm.c_cc[0x1f];
      local_58._49_3_ = oldterm._49_3_;
      local_58.c_ispeed = oldterm.c_ispeed;
      local_58.c_ospeed = oldterm.c_ospeed;
      local_58.c_cc[0xf] = oldterm.c_cc[0xf];
      local_58.c_cc[0x10] = oldterm.c_cc[0x10];
      local_58.c_cc[0x11] = oldterm.c_cc[0x11];
      local_58.c_cc[0x12] = oldterm.c_cc[0x12];
      local_58.c_cc[0x13] = oldterm.c_cc[0x13];
      local_58.c_cc[0x14] = oldterm.c_cc[0x14];
      local_58.c_cc[0x15] = oldterm.c_cc[0x15];
      local_58.c_cc[0x16] = oldterm.c_cc[0x16];
      local_58.c_cc[0x17] = oldterm.c_cc[0x17];
      local_58.c_cc[0x18] = oldterm.c_cc[0x18];
      local_58.c_cc[0x19] = oldterm.c_cc[0x19];
      local_58.c_cc[0x1a] = oldterm.c_cc[0x1a];
      local_58.c_cc[0x1b] = oldterm.c_cc[0x1b];
      local_58.c_cc[0x1c] = oldterm.c_cc[0x1c];
      local_58.c_cc[0x1d] = oldterm.c_cc[0x1d];
      local_58.c_cc[0x1e] = oldterm.c_cc[0x1e];
      local_58.c_line = oldterm.c_line;
      local_58.c_cc[0] = oldterm.c_cc[0];
      local_58.c_cc[1] = oldterm.c_cc[1];
      local_58.c_cc[2] = oldterm.c_cc[2];
      local_58.c_cc[3] = oldterm.c_cc[3];
      local_58.c_cc[4] = oldterm.c_cc[4];
      local_58.c_cc[5] = oldterm.c_cc[5];
      local_58.c_cc[6] = oldterm.c_cc[6];
      local_58.c_cc[7] = oldterm.c_cc[7];
      local_58.c_cc[8] = oldterm.c_cc[8];
      local_58.c_cc[9] = oldterm.c_cc[9];
      local_58.c_cc[10] = oldterm.c_cc[10];
      local_58.c_cc[0xb] = oldterm.c_cc[0xb];
      local_58.c_cc[0xc] = oldterm.c_cc[0xc];
      local_58.c_cc[0xd] = oldterm.c_cc[0xd];
      local_58.c_cc[0xe] = oldterm.c_cc[0xe];
      local_58._8_8_ = oldterm._8_8_ & 0xfffffff5ffffffff;
      tcsetattr(0,0,(termios *)&local_58);
      termmode = '\x01';
    }
  }
  return;
}

Assistant:

static void changemode(UINT8 noEcho)
{
	if (termmode == 0xFF)
	{
		tcgetattr(STDIN_FILENO, &oldterm);
		termmode = 0;
	}
	if (termmode == noEcho)
		return;
	
	if (noEcho)
	{
		struct termios newterm;
		newterm = oldterm;
		newterm.c_lflag &= ~(ICANON | ECHO);
		tcsetattr(STDIN_FILENO, TCSANOW, &newterm);
		termmode = 1;
	}
	else
	{
		tcsetattr(STDIN_FILENO, TCSANOW, &oldterm);
		termmode = 0;
	}
	
	return;
}